

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pedigrees.c
# Opt level: O2

void load_pedigree_leaf_into_user_worker(__cilkrts_worker *w)

{
  __cilkrts_pedigree *p_Var1;
  __cilkrts_pedigree *p_Var2;
  char *pcVar3;
  undefined8 uStack_10;
  
  if (w->l->type == WORKER_USER) {
    p_Var2 = __cilkrts_get_tls_pedigree_leaf(1);
    p_Var1 = p_Var2->parent;
    (w->pedigree).rank = p_Var2->rank;
    (w->pedigree).parent = p_Var1;
    if (w->l->original_pedigree_leaf == (__cilkrts_pedigree *)0x0) {
      w->l->original_pedigree_leaf = p_Var2;
      __cilkrts_set_tls_pedigree_leaf(&w->pedigree);
      p_Var1 = (w->pedigree).parent;
      if (p_Var1 == (__cilkrts_pedigree *)0x0) {
        pcVar3 = "w->pedigree.parent";
        uStack_10 = 0x56;
      }
      else {
        if (p_Var1->parent == (__cilkrts_pedigree *)0x0) {
          return;
        }
        pcVar3 = "w->pedigree.parent->parent == NULL";
        uStack_10 = 0x57;
      }
    }
    else {
      pcVar3 = "w->l->original_pedigree_leaf == NULL";
      uStack_10 = 0x50;
    }
  }
  else {
    pcVar3 = "w->l->type == WORKER_USER";
    uStack_10 = 0x4a;
  }
  __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/pedigrees.c"
                ,uStack_10,pcVar3);
}

Assistant:

void load_pedigree_leaf_into_user_worker(__cilkrts_worker *w)
{
    __cilkrts_pedigree *pedigree_leaf;
    CILK_ASSERT(w->l->type == WORKER_USER);
    pedigree_leaf = __cilkrts_get_tls_pedigree_leaf(1);
    w->pedigree = *pedigree_leaf;

    // Save a pointer to the old leaf.
    // We'll need to restore it later.
    CILK_ASSERT(w->l->original_pedigree_leaf == NULL);
    w->l->original_pedigree_leaf = pedigree_leaf;
    
    __cilkrts_set_tls_pedigree_leaf(&w->pedigree);
    
    // Check that this new pedigree root has at least two values.
    CILK_ASSERT(w->pedigree.parent);
    CILK_ASSERT(w->pedigree.parent->parent == NULL);
}